

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result __thiscall wabt::interp::Memory::Grow(Memory *this,u64 count)

{
  Limits *pLVar1;
  ulong uVar2;
  ulong uVar3;
  Result RVar4;
  bool bVar5;
  
  uVar2 = (this->type_).limits.max;
  uVar3 = this->pages_;
  bVar5 = uVar2 - count < uVar3;
  if (!bVar5 && uVar2 >= count) {
    pLVar1 = &(this->type_).limits;
    pLVar1->initial = pLVar1->initial + count;
    this->pages_ = uVar3 + count;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->data_,(uVar3 + count) * 0x10000);
  }
  RVar4.enum_._1_3_ = 0;
  RVar4.enum_._0_1_ = bVar5 || uVar2 < count;
  return (Result)RVar4.enum_;
}

Assistant:

Result Memory::Grow(u64 count) {
  u64 new_pages;
  if (CanGrow<u64>(type_.limits, pages_, count, &new_pages)) {
    // Grow the limits of the memory too, so that if it is used as an
    // import to another module its new size is honored.
    type_.limits.initial += count;
#if WABT_BIG_ENDIAN
    auto old_size = data_.size();
#endif
    pages_ = new_pages;
    data_.resize(new_pages * WABT_PAGE_SIZE);
#if WABT_BIG_ENDIAN
    std::move_backward(data_.begin(), data_.begin() + old_size, data_.end());
    std::fill(data_.begin(), data_.end() - old_size, 0);
#endif
    return Result::Ok;
  }
  return Result::Error;
}